

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O3

void ppMod(word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  word *b_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  word wVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong local_68;
  size_t local_58;
  
  sVar16 = wwBitSize(a,n);
  sVar17 = wwBitSize(b,m);
  local_68 = m;
  if (sVar16 < sVar17) {
    stack = a;
    if (n <= m && m - n != 0) {
      wwSetZero(r + n,m - n);
      local_68 = n;
    }
  }
  else {
    b_00 = (word *)((long)stack + n * 8 + 8);
    lVar13 = m * 8 + n * 8;
    lVar14 = lVar13 + 8;
    wwCopy((word *)stack,a,n);
    b_00[-1] = 0;
    wwCopy(b_00,b,m);
    sVar16 = wwBitSize(b + (m - 1),1);
    uVar15 = (int)sVar16 - 1U & 0x3f;
    if (uVar15 == 0) {
      local_68 = m - 1;
      r[m - 1] = 0;
      local_58 = 0;
    }
    else {
      local_58 = 0x40 - (ulong)uVar15;
      wwShHi((word *)stack,n + 1,local_58);
      wwShHi(b_00,m,local_58);
    }
    *(undefined8 *)((long)stack + m * 8 + n * 8 + 8) = 0;
    *(undefined8 *)((long)stack + m * 8 + n * 8 + 0x10) = 1;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x18) =
         *(ulong *)((long)stack +
                   (*(long *)((long)stack + local_68 * 8 + n * 8) >> 0x3f) * -8 + lVar14) ^ 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x20) =
         *(ulong *)((long)stack +
                   (ulong)(-1 < *(long *)((long)stack + local_68 * 8 + n * 8)) * 8 + lVar14) ^ 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x28) =
         *(ulong *)((long)stack +
                   (*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3e) * 8 + lVar14) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x30) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3e
                                 ) ^ 1) * 8 + lVar14) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x38) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3e
                                 ) ^ 2) * 8 + lVar14) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x40) =
         *(ulong *)((long)stack +
                   (~*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3e) * 8 + lVar14) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x48) =
         *(ulong *)((long)stack +
                   (*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3d) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x50) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 1) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x58) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 2) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x60) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 3) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x68) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 4) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x70) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 5) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x78) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 6) * 8 + lVar14) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x80) =
         *(ulong *)((long)stack +
                   (~*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3d) * 8 + lVar14) ^ 8;
    *(undefined8 *)((long)stack + m * 8 + n * 8 + 0x88) = 0;
    lVar22 = *(long *)((long)stack + local_68 * 8 + n * 8);
    *(long *)((long)stack + m * 8 + n * 8 + 0x90) = lVar22;
    *(long *)((long)stack + m * 8 + n * 8 + 0x98) = lVar22 * 2;
    uVar18 = lVar22 * 2 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xa0) = uVar18;
    *(long *)((long)stack + m * 8 + n * 8 + 0xa8) = lVar22 * 4;
    uVar20 = lVar22 * 4 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xb0) = uVar20;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xb8) = uVar18 * 2;
    uVar21 = uVar18 * 2 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xc0) = uVar21;
    *(long *)((long)stack + m * 8 + n * 8 + 200) = lVar22 << 3;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xd0) =
         lVar22 << 3 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    uVar20 = uVar20 * 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xd8) = uVar20;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xe0) =
         uVar20 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xe8) = uVar18 << 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xf0) =
         uVar18 << 2 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    uVar21 = uVar21 * 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xf8) = uVar21;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x100) =
         uVar21 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    if (local_68 <= n) {
      lVar22 = n * 8 + local_68 * -8;
      sVar16 = n;
      do {
        uVar20 = *(ulong *)((long)stack + sVar16 * 8);
        lVar1 = *(long *)((long)stack + (uVar20 >> 0x3c) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)lVar1 & 0xf) * 8 + lVar13 + 0x88) >> 4 ^
                 uVar20;
        lVar2 = *(long *)((long)stack + (ulong)((byte)(uVar20 >> 0x38) & 0xf) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)lVar2 & 0xf) * 8 + lVar13 + 0x88) >> 8 ^
                 uVar20;
        uVar21 = *(ulong *)((long)stack + (ulong)((uint)(uVar20 >> 0x34) & 0xf) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)uVar21 & 0xf) * 8 + lVar13 + 0x88) >> 0xc ^
                 uVar20;
        lVar3 = *(long *)((long)stack + (ulong)((ushort)(uVar20 >> 0x30) & 0xf) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)lVar3 & 0xf) * 8 + lVar13 + 0x88) >> 0x10 ^
                 uVar20;
        uVar18 = *(ulong *)((long)stack + (ulong)((uint)(uVar20 >> 0x2c) & 0xf) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)uVar18 & 0xf) * 8 + lVar13 + 0x88) >> 0x14 ^
                 uVar20;
        lVar4 = *(long *)((long)stack + (ulong)((uint)(uVar20 >> 0x28) & 0xf) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)lVar4 & 0xf) * 8 + lVar13 + 0x88) >> 0x18 ^
                 uVar20;
        uVar5 = *(ulong *)((long)stack + (ulong)((uint)(uVar20 >> 0x24) & 0xf) * 8 + lVar14);
        uVar20 = *(ulong *)((long)stack + (ulong)((uint)uVar5 & 0xf) * 8 + lVar13 + 0x88) >> 0x1c ^
                 uVar20;
        lVar6 = *(long *)((long)stack + (ulong)((uint)(uVar20 >> 0x20) & 0xf) * 8 + lVar14);
        uVar15 = (uint)uVar20 ^
                 *(uint *)((long)stack + (ulong)((uint)lVar6 & 0xf) * 8 + lVar13 + 0x8c);
        uVar20 = *(ulong *)((long)stack + (ulong)(uVar15 >> 0x1c) * 8 + lVar14);
        uVar15 = (uint)((ulong)*(undefined8 *)
                                ((long)stack + (ulong)((uint)uVar20 & 0xf) * 8 + lVar13 + 0x88) >>
                       0x24) ^ uVar15;
        lVar7 = *(long *)((long)stack + (ulong)(uVar15 >> 0x15 & 0x78) + lVar14);
        uVar15 = (uint)((ulong)*(undefined8 *)
                                ((long)stack + (ulong)((uint)lVar7 & 0xf) * 8 + lVar13 + 0x88) >>
                       0x28) ^ uVar15;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar15 >> 0x11 & 0x78) + lVar14);
        uVar15 = (uint)((ulong)*(undefined8 *)
                                ((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar13 + 0x88) >>
                       0x2c) ^ uVar15;
        lVar9 = *(long *)((long)stack + (ulong)(uVar15 >> 0xd & 0x78) + lVar14);
        uVar15 = *(ushort *)((long)stack + (ulong)((uint)lVar9 & 0xf) * 8 + lVar13 + 0x8e) ^ uVar15;
        uVar10 = *(ulong *)((long)stack + (ulong)(uVar15 >> 9 & 0x78) + lVar14);
        uVar15 = (uint)((ulong)*(undefined8 *)
                                ((long)stack + (ulong)((uint)uVar10 & 0xf) * 8 + lVar13 + 0x88) >>
                       0x34) ^ uVar15;
        lVar11 = *(long *)((long)stack + (ulong)(uVar15 >> 5 & 0x78) + lVar14);
        uVar15 = *(byte *)((long)stack + (ulong)((uint)lVar11 & 0xf) * 8 + lVar13 + 0x8f) ^ uVar15;
        uVar12 = *(ulong *)((long)stack + (ulong)(uVar15 >> 1 & 0x78) + lVar14);
        uVar20 = (lVar11 << 4 ^
                  (lVar9 << 4 ^
                   (lVar7 << 4 ^
                    (lVar6 << 4 ^
                     (lVar4 << 4 ^
                      (lVar3 << 4 ^ (lVar2 << 4 ^ lVar1 << 8 ^ uVar21) << 8 ^ uVar18) << 8 ^ uVar5)
                     << 8 ^ uVar20) << 8 ^ uVar8) << 8 ^ uVar10) << 8 ^ uVar12) << 4 ^
                 *(ulong *)((long)stack +
                           (ulong)((uint)((ulong)*(undefined8 *)
                                                  ((long)stack +
                                                  (ulong)((uint)uVar12 & 0xf) * 8 + lVar13 + 0x88)
                                         >> 0x3c) ^ uVar15 & 0xf) * 8 + lVar14);
        wVar19 = ppAddMulW((word *)((long)stack + lVar22),b_00,local_68,uVar20,
                           (void *)((long)stack + m * 8 + n * 8 + 0x108));
        *(word *)((long)stack + sVar16 * 8) = wVar19 ^ *(ulong *)((long)stack + sVar16 * 8) ^ uVar20
        ;
        sVar16 = sVar16 - 1;
        lVar22 = lVar22 + -8;
      } while (local_68 <= sVar16);
    }
    wwShLo((word *)stack,n + 1,local_58);
  }
  wwCopy(r,(word *)stack,local_68);
  return;
}

Assistant:

void ppMod(word r[], const word a[], size_t n, const word b[], size_t m,
	void* stack)
{
	register word dividentHi;
	register word tmp;
	register size_t shift;
	size_t i;
	// переменные в stack
	word* divident;		/* нормализованное делимое (n + 1 слово) */
	word* divisor;		/* нормализованный делитель (m слов) */
	word* w1;			/* таблица частных (16 слов) */
	word* w2;			/* таблица умножения (16 слов) */
	// pre
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// deg(a) < deg(b)?
	if (wwBitSize(a, n) < wwBitSize(b, m))
	{
		// r <- a
		if (n < m)
			wwSetZero(r + n, m - n), m = n;
		wwCopy(r, a, m);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	w1 = divisor + m;
	w2 = w1 + 16;
	stack = w2 + 16;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация -- сделать старший разряд divisor первым в старшем
	// (возможно неявном) слове
	shift = (wwBitSize(b + m - 1, 1) - 1) % B_PER_W;
	// нормализация не нужна?
	if (shift == 0)
		// обнуляем старшее слово r
		r[--m] = 0;
	else
		// сдвигаем divisor и divident
		shift = B_PER_W - shift,
		wwShHi(divident, n + 1, shift),
		wwShHi(divisor, m, shift);
	// строим таблицы
	_DIV_PRE_S4(w1, divisor[m - 1]);
	_MUL_PRE_S4(w2, divisor[m - 1]);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// tmp <- divident[i] \div (1, divisor[m - 1])
		dividentHi = divident[i];
		_DIV_DIV_S4(dividentHi, tmp, w1, w2);
		// divident <- divident - divisor * X^{i - m} * tmp
		divident[i] ^=
			ppAddMulW(divident + i - m, divisor, m, tmp, stack);
		// обработаем неявный старший разряд divisor
		divident[i] ^= tmp;
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	shift = 0;
	tmp = 0;
	dividentHi = 0;
}